

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::perturbMinLeave(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this)

{
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar1;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar2;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p_delta;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p_delta_00;
  undefined1 in_stack_fffffffffffffe38 [48];
  Status *in_stack_fffffffffffffe68;
  uint in_stack_fffffffffffffe70;
  uint in_stack_fffffffffffffe78;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_170;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_120;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_80;
  
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x6d])(&stack0xfffffffffffffe40,this);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup(&this->thePvec->thedelta);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup(&this->theCoPvec->thedelta);
  pVVar1 = this->theLbound;
  pUVar2 = this->thePvec;
  pVVar3 = this->theUbound;
  epsilon(&local_80,this);
  leavetol(&local_120,this);
  p_delta.m_backend.data._M_elems._8_8_ =
       ((this->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thedesc.stat)->data;
  p_delta.m_backend.data._M_elems._0_8_ = &local_120;
  p_delta.m_backend.data._M_elems[4] = 0;
  p_delta.m_backend.data._M_elems[5] = 0;
  p_delta.m_backend.data._M_elems[6] = 1;
  p_delta.m_backend.data._M_elems[7] = 0;
  p_delta.m_backend.data._M_elems[8] = in_stack_fffffffffffffe38._0_4_;
  p_delta.m_backend.data._M_elems[9] = in_stack_fffffffffffffe38._4_4_;
  p_delta.m_backend.data._M_elems[10] = in_stack_fffffffffffffe38._8_4_;
  p_delta.m_backend.data._M_elems[0xb] = in_stack_fffffffffffffe38._12_4_;
  p_delta.m_backend.data._M_elems[0xc] = in_stack_fffffffffffffe38._16_4_;
  p_delta.m_backend.data._M_elems[0xd] = in_stack_fffffffffffffe38._20_4_;
  p_delta.m_backend.data._M_elems[0xe] = in_stack_fffffffffffffe38._24_4_;
  p_delta.m_backend.data._M_elems[0xf] = in_stack_fffffffffffffe38._28_4_;
  p_delta.m_backend.exp = in_stack_fffffffffffffe38._32_4_;
  p_delta.m_backend.neg = (bool)in_stack_fffffffffffffe38[0x24];
  p_delta.m_backend._69_3_ = in_stack_fffffffffffffe38._37_3_;
  p_delta.m_backend.fpclass = in_stack_fffffffffffffe38._40_4_;
  p_delta.m_backend.prec_elem = in_stack_fffffffffffffe38._44_4_;
  perturbMin((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&stack0xfffffffffffffe40,this,pUVar2,pVVar1,pVVar3,&local_80,p_delta,
             in_stack_fffffffffffffe68,in_stack_fffffffffffffe70,in_stack_fffffffffffffe78);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
            (&(this->theShift).m_backend,(cpp_dec_float<100U,_int,_void> *)&stack0xfffffffffffffe40)
  ;
  pVVar1 = this->theCoLbound;
  pUVar2 = this->theCoPvec;
  pVVar3 = this->theCoUbound;
  epsilon(&local_d0,this);
  leavetol(&local_170,this);
  p_delta_00.m_backend.data._M_elems._8_8_ =
       ((this->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thedesc.costat)->data;
  p_delta_00.m_backend.data._M_elems._0_8_ = &local_170;
  p_delta_00.m_backend.data._M_elems[4] = 0;
  p_delta_00.m_backend.data._M_elems[5] = 0;
  p_delta_00.m_backend.data._M_elems[6] = 1;
  p_delta_00.m_backend.data._M_elems[7] = 0;
  p_delta_00.m_backend.data._M_elems[8] = in_stack_fffffffffffffe38._0_4_;
  p_delta_00.m_backend.data._M_elems[9] = in_stack_fffffffffffffe38._4_4_;
  p_delta_00.m_backend.data._M_elems[10] = in_stack_fffffffffffffe38._8_4_;
  p_delta_00.m_backend.data._M_elems[0xb] = in_stack_fffffffffffffe38._12_4_;
  p_delta_00.m_backend.data._M_elems[0xc] = in_stack_fffffffffffffe38._16_4_;
  p_delta_00.m_backend.data._M_elems[0xd] = in_stack_fffffffffffffe38._20_4_;
  p_delta_00.m_backend.data._M_elems[0xe] = in_stack_fffffffffffffe38._24_4_;
  p_delta_00.m_backend.data._M_elems[0xf] = in_stack_fffffffffffffe38._28_4_;
  p_delta_00.m_backend.exp = in_stack_fffffffffffffe38._32_4_;
  p_delta_00.m_backend.neg = (bool)in_stack_fffffffffffffe38[0x24];
  p_delta_00.m_backend._69_3_ = in_stack_fffffffffffffe38._37_3_;
  p_delta_00.m_backend.fpclass = in_stack_fffffffffffffe38._40_4_;
  p_delta_00.m_backend.prec_elem = in_stack_fffffffffffffe38._44_4_;
  perturbMin((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&stack0xfffffffffffffe40,this,pUVar2,pVVar1,pVVar3,&local_d0,p_delta_00,
             in_stack_fffffffffffffe68,in_stack_fffffffffffffe70,in_stack_fffffffffffffe78);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
            (&(this->theShift).m_backend,(cpp_dec_float<100U,_int,_void> *)&stack0xfffffffffffffe40)
  ;
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x6d])(&stack0xfffffffffffffe40,this);
  return;
}

Assistant:

void SPxSolverBase<R>::perturbMinLeave(void)
{
   SPxOut::debug(this, "DSHIFT05 iteration= {} perturbing {}", this->iteration(), shift());
   pVec().delta().setup();
   coPvec().delta().setup();
   theShift += perturbMin(pVec(), lpBound(), upBound(), epsilon(), leavetol(),
                          this->desc().status(), 0, 1);
   theShift += perturbMin(coPvec(), lcBound(), ucBound(), epsilon(), leavetol(),
                          this->desc().coStatus(), 0, 1);
   SPxOut::debug(this, "\t->{}\n", shift());
}